

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

void __thiscall GEO::KdTree::NearestNeighbors::copy_from_user(NearestNeighbors *this)

{
  uint uVar1;
  index_t *piVar2;
  index_t *piVar3;
  double *pdVar4;
  double *pdVar5;
  index_t i;
  ulong uVar6;
  
  piVar2 = this->user_neighbors;
  piVar3 = this->neighbors;
  pdVar4 = this->neighbors_sq_dist;
  pdVar5 = this->user_neighbors_sq_dist;
  for (uVar6 = 0; uVar6 < this->nb_neighbors_max; uVar6 = uVar6 + 1) {
    piVar3[uVar6] = piVar2[uVar6];
    pdVar4[uVar6] = pdVar5[uVar6];
  }
  piVar3[this->nb_neighbors_max] = 0xffffffff;
  uVar1 = this->nb_neighbors_max;
  pdVar4[uVar1] = 1.79769313486232e+308;
  this->nb_neighbors = uVar1;
  return;
}

Assistant:

void copy_from_user() {
		for(index_t i=0; i<nb_neighbors_max; ++i) {
		    neighbors[i] = user_neighbors[i];
		    neighbors_sq_dist[i] = user_neighbors_sq_dist[i];
		}
		neighbors[nb_neighbors_max] = index_t(-1);
		neighbors_sq_dist[nb_neighbors_max] = Numeric::max_float64();
		nb_neighbors = nb_neighbors_max;
	    }